

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_tm.cpp
# Opt level: O3

void calc<float>(options2f *opt)

{
  string *psVar1;
  func<float> fVar2;
  autodiff_fvar<float,_1UL> aVar3;
  int iVar4;
  int *piVar5;
  runtime_error *this;
  long *plVar6;
  ostream *poVar7;
  undefined8 uVar8;
  code *pcVar9;
  int iVar10;
  undefined *puVar11;
  long lVar12;
  float fVar13;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  real_t b0;
  result_t f;
  char local_d9;
  undefined1 local_d8 [16];
  float local_bc;
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  result_t local_a0;
  float local_78;
  undefined4 uStack_74;
  float local_68;
  undefined4 uStack_64;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  fVar2 = (func<float>)(opt->Jx)._M_dataplus._M_p;
  piVar5 = __errno_location();
  iVar4 = *piVar5;
  *piVar5 = 0;
  fVar13 = strtof((char *)fVar2,(char **)&local_a0);
  if ((func<float>)local_a0.derivatives_[0]._0_8_ == fVar2) {
    std::__throw_invalid_argument("stof");
LAB_001033c5:
    std::__throw_invalid_argument("stof");
LAB_001033d1:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              ((invalid_argument *)this,"Temperature should be positive");
  }
  else {
    iVar10 = *piVar5;
    local_68 = fVar13;
    uStack_64 = extraout_XMM0_Db;
    if (iVar10 == 0) {
LAB_00102d97:
      *piVar5 = iVar4;
      iVar10 = iVar4;
    }
    else if (iVar10 == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_00102d97;
    }
    fVar2 = (func<float>)(opt->Jy)._M_dataplus._M_p;
    *piVar5 = 0;
    fVar13 = strtof((char *)fVar2,(char **)&local_a0);
    if ((func<float>)local_a0.derivatives_[0]._0_8_ == fVar2) goto LAB_001033c5;
    local_78 = fVar13;
    uStack_74 = extraout_XMM0_Db_00;
    if (*piVar5 == 0) {
LAB_00102ddf:
      *piVar5 = iVar10;
    }
    else if (*piVar5 == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_00102ddf;
    }
    psVar1 = &opt->Tmin;
    iVar4 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar4 != 0) {
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 == 0) goto LAB_00102e59;
      fVar2 = (func<float>)(psVar1->_M_dataplus)._M_p;
      iVar4 = *piVar5;
      *piVar5 = 0;
      fVar13 = strtof((char *)fVar2,(char **)&local_a0);
      if ((func<float>)local_a0.derivatives_[0]._0_8_ == fVar2) {
        std::__throw_invalid_argument("stof");
LAB_00103466:
        std::__throw_invalid_argument("stof");
LAB_00103472:
        uVar8 = std::__throw_invalid_argument("stof");
        __cxa_free_exception(piVar5);
        _Unwind_Resume(uVar8);
      }
      iVar10 = *piVar5;
      local_b8 = fVar13;
      if (iVar10 == 0) {
        *piVar5 = iVar4;
      }
      else {
        iVar4 = iVar10;
        if (iVar10 == 0x22) {
          std::__throw_out_of_range("stof");
          goto LAB_00102e59;
        }
      }
      fVar2 = (func<float>)(opt->Tmax)._M_dataplus._M_p;
      *piVar5 = 0;
      fVar13 = strtof((char *)fVar2,(char **)&local_a0);
      if ((func<float>)local_a0.derivatives_[0]._0_8_ == fVar2) goto LAB_00103466;
      iVar10 = *piVar5;
      local_d8._0_4_ = fVar13;
      if (iVar10 == 0) {
LAB_00102fc0:
        *piVar5 = iVar4;
        iVar10 = iVar4;
      }
      else if (iVar10 == 0x22) {
        std::__throw_out_of_range("stof");
        goto LAB_00102fc0;
      }
      fVar2 = (func<float>)(opt->dT)._M_dataplus._M_p;
      *piVar5 = 0;
      fVar13 = strtof((char *)fVar2,(char **)&local_a0);
      if ((func<float>)local_a0.derivatives_[0]._0_8_ == fVar2) goto LAB_00103472;
      fVar14 = (float)local_d8._0_4_;
      fVar17 = local_b8;
      if (*piVar5 == 0) {
LAB_00103012:
        *piVar5 = iVar10;
      }
      else if (*piVar5 == 0x22) {
        fVar13 = (float)std::__throw_out_of_range("stof");
        goto LAB_00103012;
      }
LAB_00103015:
      lVar12 = std::cout;
      if ((0.0 <= fVar14) && (0.0 <= fVar17)) {
        if (fVar14 < fVar17) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    ((invalid_argument *)this,"Tmax should be larger than Tmin");
        }
        else {
          local_d8._0_4_ = fVar14;
          local_bc = fVar13;
          local_b8 = fVar17;
          if (0.0 < fVar13) {
            *(uint *)(cosh + *(long *)(std::cout + -0x18)) =
                 *(uint *)(cosh + *(long *)(std::cout + -0x18)) & 0xfffffefb | 0x100;
            *(undefined8 *)(strtof + *(long *)(lVar12 + -0x18)) = 6;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"# lattice: square\n",0x12);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"# precision: ",0xd);
            plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,6);
            std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
            std::ostream::put((char)plVar6);
            poVar7 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"# Lx Ly Jx Jy T 1/T F/N E/N C/N M2/N2\n",0x26);
            local_40 = (double)local_bc * 0.0001 + (double)(float)local_d8._0_4_;
            local_38 = (double)local_b8;
            if (local_38 < local_40) {
              local_48 = (double)local_68;
              local_50 = (double)local_78;
              do {
                local_d8 = ZEXT416((uint)(1.0 / local_b8));
                ising::free_energy::square::transfer_matrix<float>::calc
                          (&local_a0,opt->Lx,opt->Ly,local_68,local_78,1.0 / local_b8,0.0);
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                local_d9 = ' ';
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_d9,1);
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                local_d9 = ' ';
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_d9,1);
                poVar7 = std::ostream::_M_insert<double>(local_48);
                local_d9 = ' ';
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_d9,1);
                poVar7 = std::ostream::_M_insert<double>(local_50);
                local_d9 = ' ';
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_d9,1);
                poVar7 = std::ostream::_M_insert<double>(local_38);
                local_d9 = ' ';
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_d9,1);
                poVar7 = std::ostream::_M_insert<double>((double)(float)local_d8._0_4_);
                local_d9 = ' ';
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_d9,1);
                poVar7 = std::ostream::_M_insert<double>((double)local_a0.derivatives_[0][0]);
                local_d9 = ' ';
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_d9,1);
                poVar7 = std::ostream::_M_insert<double>
                                   ((double)(local_a0.derivatives_[1][0] * (float)local_d8._0_4_ +
                                            local_a0.derivatives_[0][0]));
                local_d9 = ' ';
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_d9,1);
                poVar7 = std::ostream::_M_insert<double>
                                   ((double)(-(float)local_d8._0_4_ * (float)local_d8._0_4_ *
                                            (local_a0.derivatives_[1][0] +
                                             local_a0.derivatives_[1][0] +
                                            local_a0.derivatives_[2][0] * (float)local_d8._0_4_)));
                local_d9 = ' ';
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_d9,1);
                poVar7 = std::ostream::_M_insert<double>
                                   ((double)(-local_a0.derivatives_[0][2] / (float)local_d8._0_4_));
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                std::ostream::put((char)poVar7);
                std::ostream::flush();
                local_b8 = local_b8 + local_bc;
                local_38 = (double)local_b8;
              } while (local_38 < local_40);
            }
            return;
          }
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument((invalid_argument *)this,"dT should be positive");
        }
        goto LAB_00103447;
      }
      goto LAB_001033d1;
    }
LAB_00102e59:
    auVar15._4_4_ = uStack_64;
    auVar15._0_4_ = local_68;
    auVar15._8_4_ = uStack_64;
    auVar15._12_4_ = uStack_74;
    auVar16._8_8_ = auVar15._8_8_;
    auVar16._4_4_ = local_78;
    auVar16._0_4_ = local_68;
    auVar16 = auVar16 & _DAT_00109020;
    if (0.0 < auVar16._0_4_ * auVar16._4_4_) {
      fVar13 = auVar16._4_4_ + auVar16._0_4_;
      fVar13 = 1.0 / (fVar13 + fVar13);
      local_d8 = ZEXT416((uint)fVar13);
      local_a0.derivatives_[0]._0_8_ = auVar16._0_8_;
      aVar3 = anon_unknown.dwarf_9be8::func<float>::operator()((func<float> *)&local_a0,fVar13);
      fVar13 = aVar3.v._M_elems[0];
      fVar14 = aVar3.v._M_elems[1];
      lVar12 = 0x100;
      do {
        local_b8 = (float)local_d8._0_4_;
        uStack_b4 = local_d8._4_4_;
        uStack_b0 = local_d8._8_4_;
        uStack_ac = local_d8._12_4_;
        local_d8._0_4_ = (float)local_d8._0_4_ - fVar13 / fVar14;
        aVar3 = anon_unknown.dwarf_9be8::func<float>::operator()
                          ((func<float> *)&local_a0,(float)local_d8._0_4_);
        fVar13 = aVar3.v._M_elems[0];
        fVar14 = aVar3.v._M_elems[1];
        if ((ABS((float)local_d8._0_4_ - local_b8) < (ABS(local_b8) + ABS(local_b8)) * 1.1920929e-07
            ) || (ABS(fVar13) < 2.3841858e-07)) {
          fVar13 = 1.0 / (float)local_d8._0_4_;
          fVar14 = fVar13;
          fVar17 = fVar13;
          goto LAB_00103015;
        }
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"convergence error");
      puVar11 = &std::runtime_error::typeinfo;
      pcVar9 = std::runtime_error::~runtime_error;
      goto LAB_00102f54;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument((invalid_argument *)this,"Jx * Jy should be non-zero");
  }
LAB_00103447:
  puVar11 = &std::invalid_argument::typeinfo;
  pcVar9 = std::invalid_argument::~invalid_argument;
LAB_00102f54:
  __cxa_throw(this,puVar11,pcVar9);
}

Assistant:

void calc(const options2f& opt) {
  typedef T real_t;
  real_t Jx = convert<real_t>(opt.Jx);
  real_t Jy = convert<real_t>(opt.Jy);
  real_t Tmin, Tmax, dT;
  if (opt.Tmin == "tc" || opt.Tmin == "Tc") {
    Tmin = Tmax = dT = ising::tc::square(Jx, Jy);
  } else {
    Tmin = convert<real_t>(opt.Tmin);
    Tmax = convert<real_t>(opt.Tmax);
    dT = convert<real_t>(opt.dT);
  }
  if (Tmin < 0 || Tmax < 0)
    throw(std::invalid_argument("Temperature should be positive"));
  if (Tmin > Tmax)
    throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (dT <= 0)
    throw(std::invalid_argument("dT should be positive"));
  std::cout << std::scientific
            << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: square\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10
            << std::endl
            << "# Lx Ly Jx Jy T 1/T F/N E/N C/N M2/N2\n";
  for (auto t = Tmin; t < Tmax + 1e-4 * dT; t += dT) {
    real_t h = 0;
    auto f =
        square::transfer_matrix<real_t>::calc(opt.Lx, opt.Ly, Jx, Jy, 1 / t, h);
    typename square::transfer_matrix<real_t>::result_t beta;
    beta.set(0, 1 / t);
    std::cout << opt.Lx << ' ' << opt.Ly << ' ' << Jx << ' ' << Jy << ' ' << t
              << ' ' << (1 / t) << ' ' << free_energy(f, beta, h) << ' '
              << energy(f, beta, h) << ' ' << specific_heat(f, beta, h) << ' '
              << magnetization2(f, beta, h) << std::endl;
  }
}